

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void add_name(char *name)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  UT_hash_handle *pUVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  lookup_t *plVar9;
  size_t sVar10;
  char *pcVar11;
  UT_hash_table *pUVar12;
  UT_hash_bucket *pUVar13;
  UT_hash_bucket *pUVar14;
  uint local_74;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  uchar *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _ha_bkt;
  lookup_t *s;
  char *name_local;
  
  plVar9 = (lookup_t *)malloc(0x40);
  if (plVar9 == (lookup_t *)0x0) {
    fprintf(_stderr,"couldn\'t get memory for lookup_t\n");
    exit(1);
  }
  plVar9->name = (char *)0x0;
  sVar10 = strlen(name);
  pcVar11 = (char *)malloc((sVar10 + 1) * 8);
  plVar9->name = pcVar11;
  if (plVar9->name == (char *)0x0) {
    fprintf(_stderr,"couldn\'t get memory for name string\n");
    exit(1);
  }
  pcVar11 = plVar9->name;
  sVar10 = strlen(name);
  strncpy(pcVar11,name,sVar10 + 1);
  (plVar9->hh).next = (void *)0x0;
  (plVar9->hh).key = plVar9->name;
  sVar10 = strlen(plVar9->name);
  (plVar9->hh).keylen = (uint)sVar10;
  if (lookup == (lookup_t *)0x0) {
    lookup = plVar9;
    (plVar9->hh).prev = (void *)0x0;
    pUVar12 = (UT_hash_table *)malloc(0x40);
    (lookup->hh).tbl = pUVar12;
    if ((lookup->hh).tbl == (UT_hash_table *)0x0) {
      exit(-1);
    }
    memset((lookup->hh).tbl,0,0x40);
    ((lookup->hh).tbl)->tail = &lookup->hh;
    ((lookup->hh).tbl)->num_buckets = 0x20;
    ((lookup->hh).tbl)->log2_num_buckets = 5;
    ((lookup->hh).tbl)->hho = 8;
    pUVar13 = (UT_hash_bucket *)malloc(0x200);
    ((lookup->hh).tbl)->buckets = pUVar13;
    if (((lookup->hh).tbl)->buckets == (UT_hash_bucket *)0x0) {
      exit(-1);
    }
    memset(((lookup->hh).tbl)->buckets,0,0x200);
    ((lookup->hh).tbl)->signature = 0xa0111fe1;
  }
  else {
    ((lookup->hh).tbl)->tail->next = plVar9;
    (plVar9->hh).prev = (void *)((long)((lookup->hh).tbl)->tail - ((lookup->hh).tbl)->hho);
    ((lookup->hh).tbl)->tail = &plVar9->hh;
  }
  pUVar12 = (lookup->hh).tbl;
  pUVar12->num_items = pUVar12->num_items + 1;
  (plVar9->hh).tbl = (lookup->hh).tbl;
  __he_bkt_i = (byte *)plVar9->name;
  (plVar9->hh).hashv = 0xfeedbeef;
  _hj_key._4_4_ = 0x9e3779b9;
  _hj_k = 0x9e3779b9;
  sVar10 = strlen(plVar9->name);
  for (_hj_key._0_4_ = (uint)sVar10; 0xb < (uint)_hj_key; _hj_key._0_4_ = (uint)_hj_key - 0xc) {
    bVar1 = *__he_bkt_i;
    bVar2 = __he_bkt_i[1];
    bVar3 = __he_bkt_i[2];
    bVar4 = __he_bkt_i[3];
    iVar6 = (uint)__he_bkt_i[4] + (uint)__he_bkt_i[5] * 0x100 + (uint)__he_bkt_i[6] * 0x10000 +
            (uint)__he_bkt_i[7] * 0x1000000 + _hj_key._4_4_;
    (plVar9->hh).hashv =
         (uint)__he_bkt_i[8] + (uint)__he_bkt_i[9] * 0x100 + (uint)__he_bkt_i[10] * 0x10000 +
         (uint)__he_bkt_i[0xb] * 0x1000000 + (plVar9->hh).hashv;
    uVar7 = (plVar9->hh).hashv >> 0xd ^
            (((uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 + (uint)bVar4 * 0x1000000 +
             _hj_k) - iVar6) - (plVar9->hh).hashv;
    uVar8 = uVar7 << 8 ^ (iVar6 - (plVar9->hh).hashv) - uVar7;
    (plVar9->hh).hashv = (plVar9->hh).hashv - uVar7;
    (plVar9->hh).hashv = (plVar9->hh).hashv - uVar8;
    (plVar9->hh).hashv = uVar8 >> 0xd ^ (plVar9->hh).hashv;
    uVar7 = (plVar9->hh).hashv >> 0xc ^ (uVar7 - uVar8) - (plVar9->hh).hashv;
    uVar8 = uVar7 << 0x10 ^ (uVar8 - (plVar9->hh).hashv) - uVar7;
    (plVar9->hh).hashv = (plVar9->hh).hashv - uVar7;
    (plVar9->hh).hashv = (plVar9->hh).hashv - uVar8;
    (plVar9->hh).hashv = uVar8 >> 5 ^ (plVar9->hh).hashv;
    _hj_k = (plVar9->hh).hashv >> 3 ^ (uVar7 - uVar8) - (plVar9->hh).hashv;
    _hj_key._4_4_ = _hj_k << 10 ^ (uVar8 - (plVar9->hh).hashv) - _hj_k;
    (plVar9->hh).hashv = (plVar9->hh).hashv - _hj_k;
    (plVar9->hh).hashv = (plVar9->hh).hashv - _hj_key._4_4_;
    (plVar9->hh).hashv = _hj_key._4_4_ >> 0xf ^ (plVar9->hh).hashv;
    __he_bkt_i = __he_bkt_i + 0xc;
  }
  sVar10 = strlen(plVar9->name);
  (plVar9->hh).hashv = (plVar9->hh).hashv + (int)sVar10;
  switch((uint)_hj_key) {
  case 0xb:
    (plVar9->hh).hashv = (uint)__he_bkt_i[10] * 0x1000000 + (plVar9->hh).hashv;
  case 10:
    (plVar9->hh).hashv = (uint)__he_bkt_i[9] * 0x10000 + (plVar9->hh).hashv;
  case 9:
    (plVar9->hh).hashv = (uint)__he_bkt_i[8] * 0x100 + (plVar9->hh).hashv;
  case 8:
    _hj_key._4_4_ = (uint)__he_bkt_i[7] * 0x1000000 + _hj_key._4_4_;
  case 7:
    _hj_key._4_4_ = (uint)__he_bkt_i[6] * 0x10000 + _hj_key._4_4_;
  case 6:
    _hj_key._4_4_ = (uint)__he_bkt_i[5] * 0x100 + _hj_key._4_4_;
  case 5:
    _hj_key._4_4_ = __he_bkt_i[4] + _hj_key._4_4_;
  case 4:
    _hj_k = (uint)__he_bkt_i[3] * 0x1000000 + _hj_k;
  case 3:
    _hj_k = (uint)__he_bkt_i[2] * 0x10000 + _hj_k;
  case 2:
    _hj_k = (uint)__he_bkt_i[1] * 0x100 + _hj_k;
  case 1:
    _hj_k = *__he_bkt_i + _hj_k;
  }
  uVar7 = (plVar9->hh).hashv >> 0xd ^ (_hj_k - _hj_key._4_4_) - (plVar9->hh).hashv;
  uVar8 = uVar7 << 8 ^ (_hj_key._4_4_ - (plVar9->hh).hashv) - uVar7;
  (plVar9->hh).hashv = (plVar9->hh).hashv - uVar7;
  (plVar9->hh).hashv = (plVar9->hh).hashv - uVar8;
  (plVar9->hh).hashv = uVar8 >> 0xd ^ (plVar9->hh).hashv;
  uVar7 = (plVar9->hh).hashv >> 0xc ^ (uVar7 - uVar8) - (plVar9->hh).hashv;
  uVar8 = uVar7 << 0x10 ^ (uVar8 - (plVar9->hh).hashv) - uVar7;
  (plVar9->hh).hashv = (plVar9->hh).hashv - uVar7;
  (plVar9->hh).hashv = (plVar9->hh).hashv - uVar8;
  (plVar9->hh).hashv = uVar8 >> 5 ^ (plVar9->hh).hashv;
  uVar7 = (plVar9->hh).hashv >> 3 ^ (uVar7 - uVar8) - (plVar9->hh).hashv;
  uVar8 = uVar7 << 10 ^ (uVar8 - (plVar9->hh).hashv) - uVar7;
  (plVar9->hh).hashv = (plVar9->hh).hashv - uVar7;
  (plVar9->hh).hashv = (plVar9->hh).hashv - uVar8;
  (plVar9->hh).hashv = uVar8 >> 0xf ^ (plVar9->hh).hashv;
  uVar7 = (plVar9->hh).hashv & ((lookup->hh).tbl)->num_buckets - 1;
  pUVar13 = ((lookup->hh).tbl)->buckets;
  pUVar13[uVar7].count = pUVar13[uVar7].count + 1;
  (plVar9->hh).hh_next = ((lookup->hh).tbl)->buckets[uVar7].hh_head;
  (plVar9->hh).hh_prev = (UT_hash_handle *)0x0;
  if (((lookup->hh).tbl)->buckets[uVar7].hh_head != (UT_hash_handle *)0x0) {
    (((lookup->hh).tbl)->buckets[uVar7].hh_head)->hh_prev = &plVar9->hh;
  }
  ((lookup->hh).tbl)->buckets[uVar7].hh_head = &plVar9->hh;
  if (((((lookup->hh).tbl)->buckets[uVar7].expand_mult + 1) * 10 <=
       ((lookup->hh).tbl)->buckets[uVar7].count) && (((plVar9->hh).tbl)->noexpand != 1)) {
    pUVar13 = (UT_hash_bucket *)malloc((ulong)(((plVar9->hh).tbl)->num_buckets << 1) << 4);
    if (pUVar13 == (UT_hash_bucket *)0x0) {
      exit(-1);
    }
    memset(pUVar13,0,(ulong)(((plVar9->hh).tbl)->num_buckets << 1) << 4);
    ((plVar9->hh).tbl)->ideal_chain_maxlen =
         (((plVar9->hh).tbl)->num_items >> ((char)((plVar9->hh).tbl)->log2_num_buckets + 1U & 0x1f))
         + (uint)((((plVar9->hh).tbl)->num_items & ((plVar9->hh).tbl)->num_buckets * 2 - 1) != 0);
    ((plVar9->hh).tbl)->nonideal_items = 0;
    for (_he_thh._0_4_ = 0; (uint)_he_thh < ((plVar9->hh).tbl)->num_buckets;
        _he_thh._0_4_ = (uint)_he_thh + 1) {
      _he_hh_nxt = ((plVar9->hh).tbl)->buckets[(uint)_he_thh].hh_head;
      while (_he_hh_nxt != (UT_hash_handle *)0x0) {
        pUVar5 = _he_hh_nxt->hh_next;
        pUVar14 = pUVar13 + (_he_hh_nxt->hashv & ((plVar9->hh).tbl)->num_buckets * 2 - 1);
        uVar7 = pUVar14->count + 1;
        pUVar14->count = uVar7;
        if (((plVar9->hh).tbl)->ideal_chain_maxlen < uVar7) {
          pUVar12 = (plVar9->hh).tbl;
          pUVar12->nonideal_items = pUVar12->nonideal_items + 1;
          pUVar14->expand_mult = pUVar14->count / ((plVar9->hh).tbl)->ideal_chain_maxlen;
        }
        _he_hh_nxt->hh_prev = (UT_hash_handle *)0x0;
        _he_hh_nxt->hh_next = pUVar14->hh_head;
        if (pUVar14->hh_head != (UT_hash_handle *)0x0) {
          pUVar14->hh_head->hh_prev = _he_hh_nxt;
        }
        pUVar14->hh_head = _he_hh_nxt;
        _he_hh_nxt = pUVar5;
      }
    }
    free(((plVar9->hh).tbl)->buckets);
    pUVar12 = (plVar9->hh).tbl;
    pUVar12->num_buckets = pUVar12->num_buckets << 1;
    pUVar12 = (plVar9->hh).tbl;
    pUVar12->log2_num_buckets = pUVar12->log2_num_buckets + 1;
    ((plVar9->hh).tbl)->buckets = pUVar13;
    if (((plVar9->hh).tbl)->num_items >> 1 < ((plVar9->hh).tbl)->nonideal_items) {
      local_74 = ((plVar9->hh).tbl)->ineff_expands + 1;
    }
    else {
      local_74 = 0;
    }
    ((plVar9->hh).tbl)->ineff_expands = local_74;
    if (1 < ((plVar9->hh).tbl)->ineff_expands) {
      ((plVar9->hh).tbl)->noexpand = 1;
    }
  }
  return;
}

Assistant:

void add_name(char *name)
{
	lookup_t *s;
	s = (lookup_t *)malloc(sizeof(lookup_t));
	if (s == NULL) {
		fprintf(stderr,"couldn't get memory for lookup_t\n");
		exit(EXIT_FAILURE);
	} else {
		s->name = NULL;
	}
	s->name = (char *)malloc(sizeof(char *) * (strlen(name)+1));
	if (s->name == NULL) {
		fprintf(stderr,"couldn't get memory for name string\n");
		exit(EXIT_FAILURE);
	}
	strncpy(s->name,name,strlen(name)+1);

	HASH_ADD_KEYPTR( hh, lookup, s->name, strlen(s->name), s );
}